

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O1

void gl4cts::BufferStorage::Buffer::LoadExtDirectStateAccess(Context *context)

{
  FUNCTIONALITY_SUPPORT FVar1;
  TestError *this;
  
  FVar1 = getDirectStateAccessSupport(context);
  if (FVar1 != FUNCTIONALITY_SUPPORT_NOT_DETERMINED) {
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
             ,0x276);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Buffer::LoadExtDirectStateAccess(deqp::Context& context)
{
	FUNCTIONALITY_SUPPORT support = getDirectStateAccessSupport(context);

	switch (support)
	{
	case FUNCTIONALITY_SUPPORT_NONE:
		/* Nothing to be done */
		break;
	case FUNCTIONALITY_SUPPORT_CORE:
	case FUNCTIONALITY_SUPPORT_EXTENSION:
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}